

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_model_ex(rf_model model,rf_vec3 position,rf_vec3 rotation_axis,float rotationAngle,
                     rf_vec3 scale,rf_color tint)

{
  rf_color rVar1;
  rf_mat left;
  rf_mat left_00;
  rf_mat left_01;
  rf_mesh mesh;
  rf_mat right;
  rf_mat right_00;
  rf_mat right_01;
  rf_material material;
  rf_mat transform;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  rf_mesh *prVar16;
  rf_model rVar17;
  long lVar18;
  rf_material *prVar19;
  undefined8 *puVar20;
  byte bVar21;
  uint *puVar22;
  undefined8 uVar23;
  undefined8 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcf0 [128];
  undefined8 in_stack_fffffffffffffdb0;
  rf_color local_210;
  rf_color color_tint;
  rf_color color;
  rf_int i;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  rf_mat mat_transform;
  rf_mat mat_translation;
  undefined1 auStack_f0 [8];
  rf_mat mat_rotation;
  rf_mat mat_scale;
  float rotationAngle_local;
  rf_color tint_local;
  float local_58;
  float fStack_54;
  rf_vec3 scale_local;
  rf_vec3 rotation_axis_local;
  float local_18;
  float fStack_14;
  rf_vec3 position_local;
  
  bVar21 = 0;
  local_58 = scale.x;
  fStack_54 = scale.y;
  rf_mat_scale((rf_mat *)&mat_rotation.m11,local_58,fStack_54,scale.z);
  rf_mat_rotate((rf_mat *)auStack_f0,rotation_axis,rotationAngle * 0.017453292);
  local_18 = position.x;
  fStack_14 = position.y;
  rf_mat_translate((rf_mat *)&mat_transform.m11,local_18,fStack_14,position.z);
  left._8_8_ = mat_scale._8_8_;
  left._0_8_ = mat_scale._0_8_;
  left._16_8_ = mat_scale._16_8_;
  left._24_8_ = mat_scale._24_8_;
  left._32_8_ = mat_scale._32_8_;
  left._40_8_ = mat_scale._40_8_;
  left._48_8_ = mat_scale._48_8_;
  left.m11 = (float)auStack_f0._0_4_;
  left.m15 = (float)auStack_f0._4_4_;
  right.m8 = mat_rotation.m8;
  right.m12 = mat_rotation.m12;
  right.m0 = mat_rotation.m0;
  right.m4 = mat_rotation.m4;
  right.m1 = mat_rotation.m1;
  right.m5 = mat_rotation.m5;
  right.m9 = mat_rotation.m9;
  right.m13 = mat_rotation.m13;
  right.m2 = mat_rotation.m2;
  right.m6 = mat_rotation.m6;
  right.m10 = mat_rotation.m10;
  right.m14 = mat_rotation.m14;
  right.m3 = mat_rotation.m3;
  right.m7 = mat_rotation.m7;
  right.m11 = (float)(int)in_stack_fffffffffffffce8;
  right.m15 = (float)(int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  rf_mat_mul(left,right);
  left_00.m8 = (float)(undefined4)local_1b0;
  left_00.m12 = (float)local_1b0._4_4_;
  left_00.m0 = (float)(undefined4)uStack_1b8;
  left_00.m4 = (float)uStack_1b8._4_4_;
  left_00.m1 = (float)(undefined4)uStack_1a8;
  left_00.m5 = (float)uStack_1a8._4_4_;
  left_00.m9 = (float)(undefined4)local_1a0;
  left_00.m13 = (float)local_1a0._4_4_;
  left_00.m2 = (float)(undefined4)uStack_198;
  left_00.m6 = (float)uStack_198._4_4_;
  left_00.m10 = (float)(undefined4)local_190;
  left_00.m14 = (float)local_190._4_4_;
  left_00.m3 = (float)(undefined4)uStack_188;
  left_00.m7 = (float)uStack_188._4_4_;
  left_00.m11 = mat_transform.m11;
  left_00.m15 = mat_transform.m15;
  right_00._8_8_ = mat_translation._8_8_;
  right_00._0_8_ = mat_translation._0_8_;
  right_00._16_8_ = mat_translation._16_8_;
  right_00._24_8_ = mat_translation._24_8_;
  right_00._32_8_ = mat_translation._32_8_;
  right_00._40_8_ = mat_translation._40_8_;
  right_00._48_8_ = mat_translation._48_8_;
  right_00.m11 = (float)(int)in_stack_fffffffffffffce8;
  right_00.m15 = (float)(int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  rf_mat_mul(left_00,right_00);
  rVar17 = model;
  left_01.m11 = (float)(undefined4)uStack_180;
  left_01.m15 = (float)uStack_180._4_4_;
  left_01.m0 = model.transform.m8;
  left_01.m4 = model.transform.m12;
  left_01.m8 = model.transform.m1;
  left_01.m12 = model.transform.m5;
  left_01.m1 = model.transform.m9;
  left_01.m5 = model.transform.m13;
  left_01.m9 = model.transform.m2;
  left_01.m13 = model.transform.m6;
  left_01.m2 = model.transform.m10;
  left_01.m6 = model.transform.m14;
  left_01.m10 = model.transform.m3;
  left_01.m14 = model.transform.m7;
  left_01.m3 = model.transform.m11;
  left_01.m7 = model.transform.m15;
  right_01.m8 = mat_transform.m8;
  right_01.m12 = mat_transform.m12;
  right_01.m0 = mat_transform.m0;
  right_01.m4 = mat_transform.m4;
  right_01.m1 = mat_transform.m1;
  right_01.m5 = mat_transform.m5;
  right_01.m9 = mat_transform.m9;
  right_01.m13 = mat_transform.m13;
  right_01.m2 = mat_transform.m2;
  right_01.m6 = mat_transform.m6;
  right_01.m10 = mat_transform.m10;
  right_01.m14 = mat_transform.m14;
  right_01.m3 = mat_transform.m3;
  right_01.m7 = mat_transform.m7;
  right_01.m11 = (float)(int)in_stack_fffffffffffffce8;
  right_01.m15 = (float)(int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  model = rVar17;
  rf_mat_mul(left_01,right_01);
  memcpy(&model,&i,0x40);
  puVar22 = (uint *)mat_transform._40_8_;
  uVar23 = mat_transform._48_8_;
  for (_color_tint = 0; rVar17 = model, _color_tint < model.mesh_count;
      _color_tint = _color_tint + 1) {
    rVar1 = (model.materials[model.mesh_material[_color_tint]].maps)->color;
    local_210.g = (char)(int)(((double)((uint)rVar1 >> 8 & 0xff) / 255.0) *
                              ((double)((uint)tint >> 8 & 0xff) / 255.0) * 255.0);
    local_210.r = (char)(int)(((double)((uint)rVar1 & 0xff) / 255.0) *
                              ((double)((uint)tint & 0xff) / 255.0) * 255.0);
    local_210.b = (char)(int)(((double)((uint)rVar1 >> 0x10 & 0xff) / 255.0) *
                              ((double)((uint)tint >> 0x10 & 0xff) / 255.0) * 255.0);
    local_210.a = (uchar)(int)(((double)((uint)rVar1 >> 0x18) / 255.0) *
                               ((double)((uint)tint >> 0x18) / 255.0) * 255.0);
    (model.materials[model.mesh_material[_color_tint]].maps)->color = local_210;
    prVar19 = model.materials + model.mesh_material[_color_tint];
    puVar20 = (undefined8 *)&stack0xfffffffffffffcd8;
    for (lVar18 = 0x13; lVar18 != 0; lVar18 = lVar18 + -1) {
      *puVar20 = *(undefined8 *)&prVar19->shader;
      prVar19 = (rf_material *)((long)prVar19 + (ulong)bVar21 * -0x10 + 8);
      puVar20 = puVar20 + (ulong)bVar21 * -2 + 1;
    }
    prVar16 = model.meshes + _color_tint;
    uVar2 = prVar16->vertices;
    uVar3 = prVar16->texcoords;
    uVar4 = prVar16->texcoords2;
    uVar5 = prVar16->normals;
    uVar6 = prVar16->tangents;
    uVar7 = prVar16->colors;
    uVar8 = prVar16->indices;
    uVar9 = prVar16->anim_vertices;
    uVar10 = prVar16->anim_normals;
    uVar11 = prVar16->bone_ids;
    uVar12 = prVar16->bone_weights;
    uVar13 = prVar16->vao_id;
    uVar14 = *(undefined4 *)&prVar16->field_0x64;
    uVar15 = prVar16->vbo_id;
    mesh._96_8_ = uVar15;
    mesh.bone_weights._4_4_ = uVar14;
    mesh.bone_weights._0_4_ = uVar13;
    mesh.bone_ids = (int *)uVar12;
    mesh.anim_normals = (float *)uVar11;
    mesh.anim_vertices = (float *)uVar10;
    mesh.indices = (unsigned_short *)uVar9;
    mesh.colors = (uchar *)uVar8;
    mesh.tangents = (float *)uVar7;
    mesh.normals = (float *)uVar6;
    mesh.texcoords2 = (float *)uVar5;
    mesh.texcoords = (float *)uVar4;
    mesh.vertices = (float *)uVar3;
    mesh._0_8_ = uVar2;
    mesh.vbo_id = puVar22;
    material.shader.locs[1] = (int)in_stack_fffffffffffffce8;
    material.shader.locs[2] = (int)((ulong)in_stack_fffffffffffffce8 >> 0x20);
    material.shader.id = (uint)(float)uVar23;
    material.shader.locs[0] = (int)SUB84(uVar23,4);
    material.shader.locs[3] = in_stack_fffffffffffffcf0._0_4_;
    material.shader.locs[4] = in_stack_fffffffffffffcf0._4_4_;
    material.shader.locs[5] = in_stack_fffffffffffffcf0._8_4_;
    material.shader.locs[6] = in_stack_fffffffffffffcf0._12_4_;
    material.shader.locs[7] = in_stack_fffffffffffffcf0._16_4_;
    material.shader.locs[8] = in_stack_fffffffffffffcf0._20_4_;
    material.shader.locs[9] = in_stack_fffffffffffffcf0._24_4_;
    material.shader.locs[10] = in_stack_fffffffffffffcf0._28_4_;
    material.shader.locs[0xb] = in_stack_fffffffffffffcf0._32_4_;
    material.shader.locs[0xc] = in_stack_fffffffffffffcf0._36_4_;
    material.shader.locs[0xd] = in_stack_fffffffffffffcf0._40_4_;
    material.shader.locs[0xe] = in_stack_fffffffffffffcf0._44_4_;
    material.shader.locs[0xf] = in_stack_fffffffffffffcf0._48_4_;
    material.shader.locs[0x10] = in_stack_fffffffffffffcf0._52_4_;
    material.shader.locs[0x11] = in_stack_fffffffffffffcf0._56_4_;
    material.shader.locs[0x12] = in_stack_fffffffffffffcf0._60_4_;
    material.shader.locs[0x13] = in_stack_fffffffffffffcf0._64_4_;
    material.shader.locs[0x14] = in_stack_fffffffffffffcf0._68_4_;
    material.shader.locs[0x15] = in_stack_fffffffffffffcf0._72_4_;
    material.shader.locs[0x16] = in_stack_fffffffffffffcf0._76_4_;
    material.shader.locs[0x17] = in_stack_fffffffffffffcf0._80_4_;
    material.shader.locs[0x18] = in_stack_fffffffffffffcf0._84_4_;
    material.shader.locs[0x19] = in_stack_fffffffffffffcf0._88_4_;
    material.shader.locs[0x1a] = in_stack_fffffffffffffcf0._92_4_;
    material.shader.locs[0x1b] = in_stack_fffffffffffffcf0._96_4_;
    material.shader.locs[0x1c] = in_stack_fffffffffffffcf0._100_4_;
    material.shader.locs[0x1d] = in_stack_fffffffffffffcf0._104_4_;
    material.shader.locs[0x1e] = in_stack_fffffffffffffcf0._108_4_;
    material.shader.locs[0x1f] = in_stack_fffffffffffffcf0._112_4_;
    material._132_4_ = in_stack_fffffffffffffcf0._116_4_;
    material.maps = (rf_material_map *)in_stack_fffffffffffffcf0._120_8_;
    material.params = (float *)model.transform._0_8_;
    transform.m11 = (float)(int)in_stack_fffffffffffffdb0;
    transform.m15 = (float)(int)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
    transform.m0 = model.transform.m8;
    transform.m4 = model.transform.m12;
    transform.m8 = model.transform.m1;
    transform.m12 = model.transform.m5;
    transform.m1 = model.transform.m9;
    transform.m5 = model.transform.m13;
    transform.m9 = model.transform.m2;
    transform.m13 = model.transform.m6;
    transform.m2 = model.transform.m10;
    transform.m6 = model.transform.m14;
    transform.m10 = model.transform.m3;
    transform.m14 = model.transform.m7;
    transform.m3 = model.transform.m11;
    transform.m7 = model.transform.m15;
    model = rVar17;
    rf_gfx_draw_mesh(mesh,material,transform);
    (model.materials[model.mesh_material[_color_tint]].maps)->color = rVar1;
  }
  return;
}

Assistant:

RF_API void rf_draw_model_ex(rf_model model, rf_vec3 position, rf_vec3 rotation_axis, float rotationAngle, rf_vec3 scale, rf_color tint)
{
    // Calculate transformation matrix from function parameters
    // Get transform matrix (rotation -> scale -> translation)
    rf_mat mat_scale = rf_mat_scale(scale.x, scale.y, scale.z);
    rf_mat mat_rotation = rf_mat_rotate(rotation_axis, rotationAngle * RF_DEG2RAD);
    rf_mat mat_translation = rf_mat_translate(position.x, position.y, position.z);

    rf_mat mat_transform = rf_mat_mul(rf_mat_mul(mat_scale, mat_rotation), mat_translation);

    // Combine model transformation matrix (model.transform) with matrix generated by function parameters (mat_transform)
    model.transform = rf_mat_mul(model.transform, mat_transform);

    for (rf_int i = 0; i < model.mesh_count; i++)
    {
        // TODO: Review color + tint premultiplication mechanism
        rf_color color = model.materials[model.mesh_material[i]].maps[RF_MAP_DIFFUSE].color;

        rf_color color_tint = RF_WHITE;
        color_tint.r = (((float)color.r/255.0)*((float)tint.r/255.0))*255;
        color_tint.g = (((float)color.g/255.0)*((float)tint.g/255.0))*255;
        color_tint.b = (((float)color.b/255.0)*((float)tint.b/255.0))*255;
        color_tint.a = (((float)color.a/255.0)*((float)tint.a/255.0))*255;

        model.materials[model.mesh_material[i]].maps[RF_MAP_DIFFUSE].color = color_tint;
        rf_gfx_draw_mesh(model.meshes[i], model.materials[model.mesh_material[i]], model.transform);
        model.materials[model.mesh_material[i]].maps[RF_MAP_DIFFUSE].color = color;
    }
}